

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlParseAttValueInternal(xmlParserCtxtPtr ctxt,int *len,int *alloc,int normalize)

{
  byte bVar1;
  xmlChar xVar2;
  xmlParserInputPtr pxVar3;
  uint uVar4;
  long lVar5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  xmlEntityPtr pxVar8;
  unsigned_long uVar9;
  xmlChar *pxVar10;
  ulong uVar11;
  int *piVar12;
  long lVar13;
  char *msg;
  xmlChar xVar14;
  int iVar15;
  xmlParserErrors error;
  byte *pbVar16;
  ulong uVar17;
  byte *pbVar18;
  byte *pbVar19;
  ulong uVar20;
  int iVar21;
  byte *pbVar22;
  byte *pbVar23;
  ulong uVar24;
  byte bVar25;
  bool bVar26;
  bool bVar27;
  int local_64;
  xmlEntityPtr local_60;
  int local_54;
  byte *local_50;
  int *local_48;
  int *local_40;
  byte *local_38;
  
  local_54 = normalize;
  local_40 = len;
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  pxVar3 = ctxt->input;
  pbVar19 = pxVar3->cur;
  iVar21 = pxVar3->line;
  if ((*pbVar19 != 0x22) && (*pbVar19 != 0x27)) {
LAB_0015d75b:
    xmlFatalErr(ctxt,XML_ERR_ATTRIBUTE_NOT_STARTED,(char *)0x0);
    return (xmlChar *)0x0;
  }
  iVar15 = pxVar3->col;
  ctxt->instate = XML_PARSER_ATTRIBUTE_VALUE;
  pbVar18 = pbVar19 + 1;
  bVar1 = *pbVar19;
  pbVar16 = pxVar3->end;
  local_48 = alloc;
  if (pbVar16 <= pbVar18) {
    pxVar6 = pxVar3->base;
    if (((long)pbVar16 - (long)pbVar19 < 0xfa) && (ctxt->progressive == 0)) {
      xmlGROW(ctxt);
    }
    if (ctxt->instate != XML_PARSER_EOF) {
      pbVar16 = ctxt->input->end;
      lVar13 = (long)ctxt->input->base - (long)pxVar6;
      lVar5 = 0;
      if (lVar13 != 0) {
        lVar5 = lVar13;
      }
      pbVar18 = pbVar18 + lVar5;
    }
    if (ctxt->instate == XML_PARSER_EOF) {
      return (xmlChar *)0x0;
    }
  }
  iVar15 = iVar15 + 1;
  if (local_54 == 0) {
    pbVar19 = pbVar18;
    if (pbVar18 < pbVar16) {
      do {
        bVar25 = *pbVar19;
        if ((((char)bVar25 < ' ' || bVar25 == bVar1) || (bVar25 == 0x26)) || (bVar25 == 0x3c))
        break;
        pbVar19 = pbVar19 + 1;
        if (pbVar16 <= pbVar19) {
          pxVar3 = ctxt->input;
          pxVar6 = pxVar3->base;
          if ((ctxt->progressive == 0) && ((long)pxVar3->end - (long)pxVar3->cur < 0xfa)) {
            xmlGROW(ctxt);
          }
          if (ctxt->instate == XML_PARSER_EOF) {
LAB_0015d4d1:
            bVar26 = false;
          }
          else {
            pbVar16 = ctxt->input->end;
            lVar13 = (long)ctxt->input->base - (long)pxVar6;
            lVar5 = 0;
            if (lVar13 != 0) {
              lVar5 = lVar13;
            }
            pbVar18 = pbVar18 + lVar5;
            pbVar19 = pbVar19 + lVar5;
            bVar26 = true;
            if ((10000000 < (long)pbVar19 - (long)pbVar18) && ((ctxt->options & 0x80000) == 0)) {
              xmlFatalErrMsg(ctxt,XML_ERR_ATTRIBUTE_NOT_FINISHED,"AttValue length too long\n");
              goto LAB_0015d4d1;
            }
          }
          if (!bVar26) {
            return (xmlChar *)0x0;
          }
        }
        iVar15 = iVar15 + 1;
      } while (pbVar19 < pbVar16);
    }
    if ((10000000 < (long)pbVar19 - (long)pbVar18) && ((ctxt->options & 0x80000) == 0))
    goto LAB_0015d6b6;
    bVar25 = *pbVar19;
    pbVar23 = pbVar19;
  }
  else {
    if (pbVar18 < pbVar16) {
      do {
        if (((*pbVar18 == bVar1) || (uVar4 = (uint)*pbVar18, 0x20 < uVar4)) ||
           ((0x100002600U >> ((ulong)uVar4 & 0x3f) & 1) == 0)) break;
        iVar15 = iVar15 + 1;
        if (uVar4 == 10) {
          iVar15 = 1;
        }
        pbVar18 = pbVar18 + 1;
        if (pbVar16 <= pbVar18) {
          pxVar3 = ctxt->input;
          pxVar6 = pxVar3->base;
          if ((ctxt->progressive == 0) && ((long)pxVar3->end - (long)pxVar3->cur < 0xfa)) {
            local_50 = pbVar16;
            xmlGROW(ctxt);
            pbVar16 = local_50;
          }
          if (ctxt->instate != XML_PARSER_EOF) {
            pbVar16 = ctxt->input->end;
            lVar13 = (long)ctxt->input->base - (long)pxVar6;
            lVar5 = 0;
            if (lVar13 != 0) {
              lVar5 = lVar13;
            }
            pbVar18 = pbVar18 + lVar5;
          }
          if (ctxt->instate == XML_PARSER_EOF) {
            return (xmlChar *)0x0;
          }
        }
        iVar21 = iVar21 + (uint)(uVar4 == 10);
      } while (pbVar18 < pbVar16);
    }
    pbVar22 = pbVar18;
    pbVar23 = pbVar18;
    if (pbVar18 < pbVar16) {
      do {
        bVar25 = *pbVar22;
        pbVar23 = pbVar22;
        if ((((char)bVar25 < ' ' || bVar25 == bVar1) || (bVar25 == 0x26)) || (bVar25 == 0x3c))
        break;
        pbVar23 = pbVar22 + 1;
        if ((bVar25 == 0x20) && (*pbVar23 == 0x20)) {
          iVar15 = iVar15 + 1;
          pbVar22 = pbVar23;
          break;
        }
        if (pbVar16 <= pbVar23) {
          pxVar3 = ctxt->input;
          pxVar6 = pxVar3->base;
          if ((ctxt->progressive == 0) && ((long)pxVar3->end - (long)pxVar3->cur < 0xfa)) {
            xmlGROW(ctxt);
          }
          if (ctxt->instate == XML_PARSER_EOF) {
LAB_0015d3c6:
            bVar26 = false;
          }
          else {
            pbVar16 = ctxt->input->end;
            lVar13 = (long)ctxt->input->base - (long)pxVar6;
            lVar5 = 0;
            if (lVar13 != 0) {
              lVar5 = lVar13;
            }
            pbVar18 = pbVar18 + lVar5;
            pbVar23 = pbVar23 + lVar5;
            bVar26 = true;
            if ((10000000 < (long)pbVar23 - (long)pbVar18) && ((ctxt->options & 0x80000) == 0)) {
              xmlFatalErrMsg(ctxt,XML_ERR_ATTRIBUTE_NOT_FINISHED,"AttValue length too long\n");
              goto LAB_0015d3c6;
            }
          }
          if (!bVar26) {
            return (xmlChar *)0x0;
          }
        }
        iVar15 = iVar15 + 1;
        pbVar22 = pbVar23;
      } while (pbVar23 < pbVar16);
    }
    do {
      pbVar19 = pbVar22;
      if (pbVar19[-1] != 0x20) break;
      pbVar22 = pbVar19 + -1;
    } while (pbVar18 < pbVar19);
    if (pbVar23 < pbVar16) {
      do {
        if (((*pbVar23 == bVar1) || (uVar4 = (uint)*pbVar23, 0x20 < uVar4)) ||
           ((0x100002600U >> ((ulong)uVar4 & 0x3f) & 1) == 0)) break;
        iVar15 = iVar15 + 1;
        bVar25 = uVar4 == 10;
        if ((bool)bVar25) {
          iVar15 = 1;
        }
        pbVar23 = pbVar23 + 1;
        if (pbVar16 <= pbVar23) {
          pxVar3 = ctxt->input;
          pxVar6 = pxVar3->base;
          if ((ctxt->progressive == 0) && ((long)pxVar3->end - (long)pxVar3->cur < 0xfa)) {
            local_60 = (xmlEntityPtr)CONCAT71(local_60._1_7_,bVar25);
            local_50 = pbVar16;
            local_38 = pbVar18;
            xmlGROW(ctxt);
            pbVar18 = local_38;
            pbVar16 = local_50;
            bVar25 = (byte)local_60;
          }
          if (ctxt->instate == XML_PARSER_EOF) {
            bVar26 = false;
          }
          else {
            local_60 = (xmlEntityPtr)CONCAT71(local_60._1_7_,bVar25);
            lVar13 = (long)ctxt->input->base - (long)pxVar6;
            lVar5 = 0;
            if (lVar13 != 0) {
              lVar5 = lVar13;
            }
            pbVar16 = ctxt->input->end;
            pbVar19 = pbVar19 + lVar5;
            pbVar18 = pbVar18 + lVar5;
            pbVar23 = pbVar23 + lVar5;
            bVar26 = true;
            if ((10000000 < (long)pbVar23 - (long)pbVar18) && ((ctxt->options & 0x80000) == 0)) {
              local_50 = pbVar16;
              xmlFatalErrMsg(ctxt,XML_ERR_ATTRIBUTE_NOT_FINISHED,"AttValue length too long\n");
              bVar26 = false;
              pbVar16 = local_50;
            }
            bVar25 = (byte)local_60;
          }
          if (!bVar26) {
            return (xmlChar *)0x0;
          }
        }
        iVar21 = iVar21 + (uint)bVar25;
      } while (pbVar23 < pbVar16);
    }
    if ((10000000 < (long)pbVar23 - (long)pbVar18) && ((ctxt->options & 0x80000) == 0)) {
LAB_0015d6b6:
      xmlFatalErrMsg(ctxt,XML_ERR_ATTRIBUTE_NOT_FINISHED,"AttValue length too long\n");
      return (xmlChar *)0x0;
    }
    bVar25 = *pbVar23;
  }
  if (bVar25 == bVar1) {
    if (local_40 == (int *)0x0) {
      if (local_48 != (int *)0x0) {
        *local_48 = 1;
      }
      pbVar18 = xmlStrndup(pbVar18,(int)pbVar19 - (int)pbVar18);
    }
    else {
      *local_40 = (int)pbVar19 - (int)pbVar18;
    }
    pxVar3 = ctxt->input;
    pxVar3->cur = pbVar23 + 1;
    pxVar3->line = iVar21;
    pxVar3->col = iVar15 + 1;
    if (local_48 != (int *)0x0) {
      *local_48 = 0;
      return pbVar18;
    }
    return pbVar18;
  }
  if (local_48 != (int *)0x0) {
    *local_48 = 1;
  }
  xVar14 = *ctxt->input->cur;
  if (xVar14 != '\"') {
    if (xVar14 != '\'') goto LAB_0015d75b;
    xVar14 = '\'';
  }
  ctxt->instate = XML_PARSER_ATTRIBUTE_VALUE;
  xmlNextChar(ctxt);
  pxVar6 = (xmlChar *)(*xmlMallocAtomic)(100);
  if (pxVar6 == (xmlChar *)0x0) {
    pbVar18 = (byte *)0x0;
    pxVar6 = (xmlChar *)0x0;
  }
  else {
    uVar4 = xmlCurrentChar(ctxt,&local_64);
    pxVar7 = ctxt->input->cur;
    bVar26 = false;
    if (xVar14 == *pxVar7) {
      uVar17 = 0;
    }
    else {
      uVar20 = 100;
      uVar17 = 0;
      bVar26 = false;
      do {
        if ((int)uVar4 < 0x100) {
          if ((int)uVar4 < 0x20) {
            if ((0xd < uVar4) || ((0x2600U >> (uVar4 & 0x1f) & 1) == 0)) break;
          }
          else if (uVar4 == 0x3c) break;
        }
        else if ((uVar4 - 0x110000 < 0xfff00000 && uVar4 - 0xfffe < 0xffffe002) &&
                 0xd7ff < (int)uVar4) break;
        if (ctxt->instate == XML_PARSER_EOF) break;
        if ((10000000 < uVar17) && ((ctxt->options & 0x80000) == 0)) goto LAB_0015e095;
        if (uVar4 < 0x27) {
          if ((0x100002600U >> ((ulong)uVar4 & 0x3f) & 1) != 0) {
            if ((local_54 == 0) || (uVar17 != 0)) {
              if ((local_54 == 0) || (!bVar26)) {
                if (local_64 == 1) {
                  pxVar6[uVar17] = ' ';
                  uVar17 = uVar17 + 1;
                }
                else {
                  iVar21 = xmlCopyCharMultiByte(pxVar6 + uVar17,0x20);
                  uVar17 = uVar17 + (long)iVar21;
                }
                while (uVar20 < uVar17 + 10) {
                  uVar11 = uVar20 * 2 + 10;
                  if (uVar11 < uVar20) {
                    bVar26 = false;
                  }
                  else {
                    pxVar7 = (xmlChar *)(*xmlRealloc)(pxVar6,uVar11);
                    bVar26 = pxVar7 != (xmlChar *)0x0;
                    if (bVar26) {
                      pxVar6 = pxVar7;
                      uVar20 = uVar11;
                    }
                  }
                  if (!bVar26) goto LAB_0015e0ab;
                }
                bVar26 = true;
              }
              else {
                bVar26 = true;
              }
            }
            else {
              uVar17 = 0;
            }
            goto LAB_0015dabf;
          }
          if ((ulong)uVar4 != 0x26) goto LAB_0015d935;
          if (pxVar7[1] == '#') {
            iVar21 = xmlParseCharRef(ctxt);
            if (iVar21 == 0) {
              bVar26 = false;
            }
            else {
              uVar11 = uVar17 + 10;
              if (iVar21 == 0x26) {
                if (ctxt->replaceEntities == 0) {
                  if (uVar20 < uVar11) {
                    uVar11 = uVar20 * 2 + 10;
                    if (uVar11 < uVar20) {
                      bVar26 = true;
                      bVar27 = false;
                    }
                    else {
                      pxVar7 = (xmlChar *)(*xmlRealloc)(pxVar6,uVar11);
                      bVar26 = pxVar7 == (xmlChar *)0x0;
                      if (!bVar26) {
                        uVar20 = uVar11;
                      }
                      bVar27 = !bVar26;
                      if (!bVar26) {
                        pxVar6 = pxVar7;
                      }
                    }
                    if (!bVar27) goto LAB_0015dedf;
                  }
                  builtin_memcpy(pxVar6 + uVar17,"&#38;",5);
                  uVar17 = uVar17 + 5;
                }
                else {
                  if (uVar20 < uVar11) {
                    uVar11 = uVar20 * 2 + 10;
                    if (uVar11 < uVar20) {
                      bVar26 = true;
                      bVar27 = false;
                    }
                    else {
                      pxVar7 = (xmlChar *)(*xmlRealloc)(pxVar6,uVar11);
                      bVar26 = pxVar7 == (xmlChar *)0x0;
                      if (!bVar26) {
                        uVar20 = uVar11;
                      }
                      bVar27 = !bVar26;
                      if (!bVar26) {
                        pxVar6 = pxVar7;
                      }
                    }
                    if (!bVar27) goto LAB_0015dedf;
                  }
                  pxVar6[uVar17] = '&';
                  uVar17 = uVar17 + 1;
                }
                bVar26 = false;
              }
              else {
                if (uVar20 < uVar11) {
                  uVar11 = uVar20 * 2 + 10;
                  if (uVar11 < uVar20) {
                    bVar26 = true;
                    bVar27 = false;
                  }
                  else {
                    pxVar7 = (xmlChar *)(*xmlRealloc)(pxVar6,uVar11);
                    bVar26 = pxVar7 == (xmlChar *)0x0;
                    if (!bVar26) {
                      uVar20 = uVar11;
                    }
                    bVar27 = !bVar26;
                    if (!bVar26) {
                      pxVar6 = pxVar7;
                    }
                  }
                  if (!bVar27) goto LAB_0015dedf;
                }
                iVar21 = xmlCopyChar(0,pxVar6 + uVar17,iVar21);
                uVar17 = uVar17 + (long)iVar21;
                bVar26 = false;
              }
            }
LAB_0015dedf:
            if (bVar26) {
LAB_0015e13a:
              if (!bVar26) {
                return pxVar6;
              }
              goto LAB_0015e0ab;
            }
            bVar26 = false;
          }
          else {
            pxVar8 = xmlParseEntityRef(ctxt);
            uVar9 = ctxt->nbentities + 1;
            ctxt->nbentities = uVar9;
            bVar26 = false;
            if (pxVar8 != (xmlEntityPtr)0x0) {
              ctxt->nbentities = uVar9 + (long)pxVar8->owner;
              if (pxVar8->etype == XML_INTERNAL_PREDEFINED_ENTITY) {
                if (uVar20 < uVar17 + 10) {
                  uVar11 = uVar20 * 2 + 10;
                  if (uVar11 < uVar20) {
                    bVar27 = false;
                  }
                  else {
                    local_60 = pxVar8;
                    pxVar7 = (xmlChar *)(*xmlRealloc)(pxVar6,uVar11);
                    bVar27 = pxVar7 != (xmlChar *)0x0;
                    pxVar8 = local_60;
                    if (bVar27) {
                      pxVar6 = pxVar7;
                      uVar20 = uVar11;
                    }
                  }
                  if (!bVar27) goto LAB_0015e0ab;
                }
                if ((ctxt->replaceEntities == 0) && (*pxVar8->content == '&')) {
                  builtin_memcpy(pxVar6 + uVar17,"&#38;",5);
                  uVar17 = uVar17 + 5;
                }
                else {
                  pxVar6[uVar17] = *pxVar8->content;
                  uVar17 = uVar17 + 1;
                }
              }
              else {
                if (ctxt->replaceEntities == 0) {
                  iVar21 = xmlStrlen(pxVar8->name);
                  local_48 = (int *)pxVar8->name;
                  if (((pxVar8->etype != XML_INTERNAL_PREDEFINED_ENTITY) &&
                      (pxVar7 = pxVar8->content, pxVar7 != (xmlChar *)0x0)) &&
                     (pxVar8->checked == 0)) {
                    uVar9 = ctxt->nbentities;
                    ctxt->depth = ctxt->depth + 1;
                    pxVar7 = xmlStringDecodeEntities(ctxt,pxVar7,1,'\0','\0','\0');
                    ctxt->depth = ctxt->depth + -1;
                    uVar11 = (ctxt->nbentities - uVar9) + 1;
                    if (0x3ffffffe < uVar11) {
                      uVar11 = 0x3fffffff;
                    }
                    pxVar8->checked = (int)uVar11 * 2;
                    if (pxVar7 == (xmlChar *)0x0) {
                      *pxVar8->content = '\0';
                    }
                    else {
                      pxVar10 = xmlStrchr(pxVar7,'<');
                      if (pxVar10 != (xmlChar *)0x0) {
                        *(byte *)&pxVar8->checked = (byte)pxVar8->checked | 1;
                      }
                      (*xmlFree)(pxVar7);
                    }
                  }
                  uVar11 = uVar17 + 1;
                  pxVar6[uVar17] = '&';
                  pxVar8 = (xmlEntityPtr)((long)iVar21 + 10);
                  local_60 = pxVar8;
LAB_0015df19:
                  if (uVar20 < uVar17 + (long)iVar21 + 0xb) goto code_r0x0015df1e;
                  if (0 < iVar21) {
                    iVar21 = iVar21 + 1;
                    piVar12 = local_48;
                    do {
                      iVar15 = *piVar12;
                      piVar12 = (int *)((long)piVar12 + 1);
                      pxVar6[uVar11] = (xmlChar)iVar15;
                      uVar11 = uVar11 + 1;
                      iVar21 = iVar21 + -1;
                    } while (1 < iVar21);
                  }
                  pxVar6[uVar11] = ';';
                  uVar11 = uVar11 + 1;
                  bVar26 = false;
LAB_0015dfa1:
                  if (bVar26) goto LAB_0015e13a;
                  bVar26 = false;
                  uVar17 = uVar11;
                  goto LAB_0015daea;
                }
                ctxt->depth = ctxt->depth + 1;
                bVar26 = false;
                pbVar18 = xmlStringDecodeEntities(ctxt,pxVar8->content,1,'\0','\0','\0');
                ctxt->depth = ctxt->depth + -1;
                pbVar19 = pbVar18;
                if (pbVar18 != (byte *)0x0) {
                  while( true ) {
                    bVar1 = *pbVar19;
                    bVar25 = 0x20;
                    if (((1 < bVar1 - 9) && (bVar1 != 0xd)) && (bVar25 = bVar1, bVar1 == 0)) break;
                    pxVar6[uVar17] = bVar25;
                    uVar11 = uVar17 + 1;
                    pbVar19 = pbVar19 + 1;
                    uVar24 = uVar17 + 0xb;
                    uVar17 = uVar11;
                    if (uVar20 < uVar24) {
                      uVar11 = uVar20 * 2 + 10;
                      if (uVar11 < uVar20) {
                        bVar26 = false;
                      }
                      else {
                        pxVar7 = (xmlChar *)(*xmlRealloc)(pxVar6,uVar11);
                        bVar26 = pxVar7 != (xmlChar *)0x0;
                        if (bVar26) {
                          pxVar6 = pxVar7;
                          uVar20 = uVar11;
                        }
                      }
                      if (!bVar26) goto LAB_0015e0ae;
                    }
                  }
                  (*xmlFree)(pbVar18);
                  bVar26 = false;
                }
              }
            }
          }
        }
        else {
LAB_0015d935:
          if (local_64 == 1) {
            pxVar6[uVar17] = (xmlChar)uVar4;
            uVar17 = uVar17 + 1;
          }
          else {
            iVar21 = xmlCopyCharMultiByte(pxVar6 + uVar17,uVar4);
            uVar17 = uVar17 + (long)iVar21;
          }
          bVar26 = false;
          if (uVar20 < uVar17 + 10) {
            uVar11 = uVar20 * 2 + 10;
            bVar26 = false;
            if (uVar11 < uVar20) {
              bVar27 = false;
            }
            else {
              pxVar7 = (xmlChar *)(*xmlRealloc)(pxVar6,uVar11);
              bVar27 = pxVar7 != (xmlChar *)0x0;
              if (bVar27) {
                pxVar6 = pxVar7;
                uVar20 = uVar11;
              }
            }
            if (!bVar27) goto LAB_0015e0ab;
          }
LAB_0015dabf:
          pxVar3 = ctxt->input;
          if (*pxVar3->cur == '\n') {
            pxVar3->line = pxVar3->line + 1;
            pxVar3->col = 1;
          }
          else {
            pxVar3->col = pxVar3->col + 1;
          }
          pxVar3->cur = pxVar3->cur + local_64;
        }
LAB_0015daea:
        if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
          xmlGROW(ctxt);
        }
        uVar4 = xmlCurrentChar(ctxt,&local_64);
        pxVar7 = ctxt->input->cur;
      } while (xVar14 != *pxVar7);
    }
    if (ctxt->instate == XML_PARSER_EOF) {
      pbVar18 = (byte *)0x0;
      goto LAB_0015e0b8;
    }
    if ((bVar26 && local_54 != 0) && (uVar17 != 0)) {
      do {
        if (pxVar6[uVar17 - 1] != ' ') goto LAB_0015dffb;
        uVar17 = uVar17 - 1;
      } while (uVar17 != 0);
      uVar17 = 0;
    }
LAB_0015dffb:
    pxVar6[uVar17] = '\0';
    xVar2 = *ctxt->input->cur;
    if (xVar2 == '<') {
      xmlFatalErr(ctxt,XML_ERR_LT_IN_ATTRIBUTE,(char *)0x0);
    }
    else if (xVar14 == xVar2) {
      xmlNextChar(ctxt);
    }
    else {
      if (uVar4 == 0) {
LAB_0015e06e:
        msg = "AttValue: \' expected\n";
        error = XML_ERR_ATTRIBUTE_NOT_FINISHED;
      }
      else {
        if ((int)uVar4 < 0x100) {
          if ((0x1f < (int)uVar4) || ((uVar4 < 0xe && ((0x2600U >> (uVar4 & 0x1f) & 1) != 0))))
          goto LAB_0015e06e;
        }
        else if ((uVar4 - 0x10000 < 0x100000 || uVar4 - 0xe000 < 0x1ffe) || (int)uVar4 < 0xd800)
        goto LAB_0015e06e;
        msg = "invalid character in attribute value\n";
        error = XML_ERR_INVALID_CHAR;
      }
      xmlFatalErrMsg(ctxt,error,msg);
    }
    if (uVar17 < 0x7fffffff) {
      if (local_40 != (int *)0x0) {
        *local_40 = (int)uVar17;
        return pxVar6;
      }
      return pxVar6;
    }
LAB_0015e095:
    xmlFatalErrMsg(ctxt,XML_ERR_ATTRIBUTE_NOT_FINISHED,"AttValue length too long\n");
LAB_0015e0ab:
    pbVar18 = (byte *)0x0;
  }
LAB_0015e0ae:
  xmlErrMemory(ctxt,(char *)0x0);
LAB_0015e0b8:
  if (pxVar6 != (xmlChar *)0x0) {
    (*xmlFree)(pxVar6);
  }
  if (pbVar18 == (byte *)0x0) {
    return (xmlChar *)0x0;
  }
  (*xmlFree)(pbVar18);
  return (xmlChar *)0x0;
code_r0x0015df1e:
  uVar24 = (long)&pxVar8->_private + uVar20 * 2;
  if (uVar24 < uVar20) {
    bVar26 = true;
    bVar27 = false;
  }
  else {
    pxVar7 = (xmlChar *)(*xmlRealloc)(pxVar6,uVar24);
    bVar26 = pxVar7 == (xmlChar *)0x0;
    if (!bVar26) {
      uVar20 = uVar24;
    }
    bVar27 = !bVar26;
    pxVar8 = local_60;
    if (!bVar26) {
      pxVar6 = pxVar7;
    }
  }
  if (!bVar27) goto LAB_0015dfa1;
  goto LAB_0015df19;
}

Assistant:

static xmlChar *
xmlParseAttValueInternal(xmlParserCtxtPtr ctxt, int *len, int *alloc,
                         int normalize)
{
    xmlChar limit = 0;
    const xmlChar *in = NULL, *start, *end, *last;
    xmlChar *ret = NULL;
    int line, col;

    GROW;
    in = (xmlChar *) CUR_PTR;
    line = ctxt->input->line;
    col = ctxt->input->col;
    if (*in != '"' && *in != '\'') {
        xmlFatalErr(ctxt, XML_ERR_ATTRIBUTE_NOT_STARTED, NULL);
        return (NULL);
    }
    ctxt->instate = XML_PARSER_ATTRIBUTE_VALUE;

    /*
     * try to handle in this routine the most common case where no
     * allocation of a new string is required and where content is
     * pure ASCII.
     */
    limit = *in++;
    col++;
    end = ctxt->input->end;
    start = in;
    if (in >= end) {
        GROW_PARSE_ATT_VALUE_INTERNAL(ctxt, in, start, end)
    }
    if (normalize) {
        /*
	 * Skip any leading spaces
	 */
	while ((in < end) && (*in != limit) &&
	       ((*in == 0x20) || (*in == 0x9) ||
	        (*in == 0xA) || (*in == 0xD))) {
	    if (*in == 0xA) {
	        line++; col = 1;
	    } else {
	        col++;
	    }
	    in++;
	    start = in;
	    if (in >= end) {
                GROW_PARSE_ATT_VALUE_INTERNAL(ctxt, in, start, end)
                if (((in - start) > XML_MAX_TEXT_LENGTH) &&
                    ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                                   "AttValue length too long\n");
                    return(NULL);
                }
	    }
	}
	while ((in < end) && (*in != limit) && (*in >= 0x20) &&
	       (*in <= 0x7f) && (*in != '&') && (*in != '<')) {
	    col++;
	    if ((*in++ == 0x20) && (*in == 0x20)) break;
	    if (in >= end) {
                GROW_PARSE_ATT_VALUE_INTERNAL(ctxt, in, start, end)
                if (((in - start) > XML_MAX_TEXT_LENGTH) &&
                    ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                                   "AttValue length too long\n");
                    return(NULL);
                }
	    }
	}
	last = in;
	/*
	 * skip the trailing blanks
	 */
	while ((last[-1] == 0x20) && (last > start)) last--;
	while ((in < end) && (*in != limit) &&
	       ((*in == 0x20) || (*in == 0x9) ||
	        (*in == 0xA) || (*in == 0xD))) {
	    if (*in == 0xA) {
	        line++, col = 1;
	    } else {
	        col++;
	    }
	    in++;
	    if (in >= end) {
		const xmlChar *oldbase = ctxt->input->base;
		GROW;
                if (ctxt->instate == XML_PARSER_EOF)
                    return(NULL);
		if (oldbase != ctxt->input->base) {
		    ptrdiff_t delta = ctxt->input->base - oldbase;
		    start = start + delta;
		    in = in + delta;
		    last = last + delta;
		}
		end = ctxt->input->end;
                if (((in - start) > XML_MAX_TEXT_LENGTH) &&
                    ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                                   "AttValue length too long\n");
                    return(NULL);
                }
	    }
	}
        if (((in - start) > XML_MAX_TEXT_LENGTH) &&
            ((ctxt->options & XML_PARSE_HUGE) == 0)) {
            xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                           "AttValue length too long\n");
            return(NULL);
        }
	if (*in != limit) goto need_complex;
    } else {
	while ((in < end) && (*in != limit) && (*in >= 0x20) &&
	       (*in <= 0x7f) && (*in != '&') && (*in != '<')) {
	    in++;
	    col++;
	    if (in >= end) {
                GROW_PARSE_ATT_VALUE_INTERNAL(ctxt, in, start, end)
                if (((in - start) > XML_MAX_TEXT_LENGTH) &&
                    ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                                   "AttValue length too long\n");
                    return(NULL);
                }
	    }
	}
	last = in;
        if (((in - start) > XML_MAX_TEXT_LENGTH) &&
            ((ctxt->options & XML_PARSE_HUGE) == 0)) {
            xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                           "AttValue length too long\n");
            return(NULL);
        }
	if (*in != limit) goto need_complex;
    }
    in++;
    col++;
    if (len != NULL) {
        *len = last - start;
        ret = (xmlChar *) start;
    } else {
        if (alloc) *alloc = 1;
        ret = xmlStrndup(start, last - start);
    }
    CUR_PTR = in;
    ctxt->input->line = line;
    ctxt->input->col = col;
    if (alloc) *alloc = 0;
    return ret;
need_complex:
    if (alloc) *alloc = 1;
    return xmlParseAttValueComplex(ctxt, len, normalize);
}